

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

bool __thiscall MeterPrivate::thresholdFired(MeterPrivate *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  RangeData *pRVar4;
  int *piVar5;
  double dVar6;
  double local_30;
  const_iterator local_28;
  const_iterator last;
  const_iterator it;
  bool res;
  MeterPrivate *this_local;
  
  last = QMultiMap<int,_MeterPrivate::RangeData>::cbegin(&this->ranges);
  local_28._M_node = (_Base_ptr)QMultiMap<int,_MeterPrivate::RangeData>::cend(&this->ranges);
  do {
    bVar3 = operator!=(&last,(const_iterator *)&local_28);
    if (!bVar3) {
      return false;
    }
    dVar6 = this->value;
    pRVar4 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::value(&last);
    if (pRVar4->start <= dVar6 && dVar6 != pRVar4->start) {
LAB_00113238:
      dVar6 = this->value;
      pRVar4 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::value(&last);
      bVar3 = dVar6 < pRVar4->stop;
    }
    else {
      dVar6 = this->value;
      pRVar4 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::value(&last);
      local_30 = dVar6 - pRVar4->start;
      dVar6 = qAbs<double>(&local_30);
      bVar3 = false;
      if (dVar6 < 1e-06) goto LAB_00113238;
    }
    if (bVar3) {
      iVar2 = this->currentThreshold;
      piVar5 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::key(&last);
      iVar1 = *piVar5;
      piVar5 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::key(&last);
      this->currentThreshold = *piVar5;
      return iVar2 != iVar1;
    }
    QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::operator++(&last);
  } while( true );
}

Assistant:

bool
MeterPrivate::thresholdFired()
{
	bool res = false;

	for( auto it = ranges.cbegin(), last = ranges.cend(); it != last; ++it )
	{
		if( ( value > it.value().start || qAbs( value - it.value().start ) < 0.000001 ) &&
			value < it.value().stop )
		{
			if( currentThreshold != it.key() )
				res = true;

			currentThreshold = it.key();

			break;
		}
	}

	return res;
}